

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O1

size_t utf8_range_ValidPrefix(char *data,size_t len)

{
  ulong *puVar1;
  ulong *data_00;
  size_t sVar2;
  long lVar3;
  ulong *end;
  
  if (len == 0) {
    return 0;
  }
  end = (ulong *)(data + len);
  puVar1 = (ulong *)data;
  if (7 < (long)len) {
    do {
      if ((*puVar1 & 0x8080808080808080) != 0) break;
      puVar1 = puVar1 + 1;
      len = len - 8;
    } while (7 < (long)len);
  }
  data_00 = puVar1;
  if (puVar1 < end) {
    lVar3 = (long)end - (long)puVar1;
    do {
      data_00 = puVar1;
      if ((char)*puVar1 < '\0') break;
      puVar1 = (ulong *)((long)puVar1 + 1);
      lVar3 = lVar3 + -1;
      data_00 = end;
    } while (lVar3 != 0);
  }
  sVar2 = utf8_range_ValidateUTF8Naive((char *)data_00,(char *)end,1);
  return (long)data_00 + (sVar2 - (long)data);
}

Assistant:

size_t utf8_range_ValidPrefix(const char* data, size_t len) {
  return utf8_range_Validate(data, len, /*return_position=*/1);
}